

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall
CMeshClosestPointMapper::TcSeamlessPatch::AddNextStepFi(TcSeamlessPatch *this,int fi)

{
  iterator __position;
  int *piVar1;
  int local_4;
  
  piVar1 = (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  while( true ) {
    if (piVar1 == __position._M_current) {
      if (__position._M_current ==
          (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_nextStepFis,__position,&local_4);
      }
      else {
        *__position._M_current = fi;
        (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      return;
    }
    if (*piVar1 == fi) break;
    piVar1 = piVar1 + 1;
  }
  return;
}

Assistant:

void AddNextStepFi(int fi)
    {
      for (int nextStepFi : m_nextStepFis)
      {
        if (fi == nextStepFi)
          return;
      }
      m_nextStepFis.push_back(fi);
    }